

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirSAVEAMSDOS(void)

{
  bool bVar1;
  int iVar2;
  EStatus type;
  char *message;
  aint args [4];
  bool optional [4];
  path fnaam;
  int local_58 [2];
  undefined8 uStack_50;
  bool local_3c [4];
  path local_38;
  
  iVar2 = pass;
  if (DeviceID == (char *)0x0) {
    Error("SAVEAMSDOS works in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&local_38,&lp);
  local_58[0] = -1;
  local_58[1] = -1;
  uStack_50 = 0x200000000;
  local_3c[0] = false;
  local_3c[1] = false;
  local_3c[2] = true;
  local_3c[3] = true;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = getIntArguments<4>(&lp,(aint (*) [4])local_58,&local_3c);
    if (bVar1) {
      type = PASS3;
      message = "[SAVEAMSDOS] [address, size] region outside of 64ki";
      if ((-1 < local_58[0]) && (local_58[0] + local_58[1] < 0x10001 && 0 < local_58[1])) {
        check16u((aint)uStack_50);
        if (uStack_50 < 0) {
          uStack_50 = CONCAT44(0xfffff000,(aint)uStack_50);
        }
        check8(uStack_50._4_4_);
        if (iVar2 != 3) goto LAB_0010fc6d;
        iVar2 = SaveBinaryAmsdos(&local_38,local_58[0],local_58[1],(word)uStack_50,uStack_50._4_1_);
        if (iVar2 != 0) goto LAB_0010fc6d;
        type = IF_FIRST;
        message = "[SAVEAMSDOS] Error writing file (Disk full?)";
      }
      Error(message,bp,type);
      goto LAB_0010fc6d;
    }
  }
  Error("[SAVEAMSDOS] expected syntax is <filename>,<address>,<size>[,<start = 0>[,<type = 2>]",bp,
        SUPPRESS);
LAB_0010fc6d:
  std::filesystem::__cxx11::path::~path(&local_38);
  return;
}

Assistant:

static void dirSAVEAMSDOS() {
	if (!DeviceID) {
		Error("SAVEAMSDOS works in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}
	bool exec = (LASTPASS == pass);
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	aint args[] = { -1, -1, 0, 2 };	// address, size, start, type
	const bool optional[] = {false, false, true, true};
	if (!anyComma(lp) || !getIntArguments<4>(lp, args, optional)) {
		Error("[SAVEAMSDOS] expected syntax is <filename>,<address>,<size>[,<start = 0>[,<type = 2>]", bp, SUPPRESS);
		return;
	}
	aint &address = args[0], &size = args[1], &start = args[2], &type = args[3];
	if (address < 0 || size < 1 || 0x10000 < address + size) {
		Error("[SAVEAMSDOS] [address, size] region outside of 64ki", bp);
		return;
	}
	check16u(start);
	if (type < 0) type = -0x1000;		// check8 works for -256..+255 values, in this case just 0..255 is valid
	check8(type);
	if (exec && !SaveBinaryAmsdos(fnaam, address, size, start, type)) {
		Error("[SAVEAMSDOS] Error writing file (Disk full?)", bp, IF_FIRST);
	}
}